

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::ReadLogicalExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                  *this)

{
  TextReader<fmt::Locale> *pTVar1;
  byte *pbVar2;
  bool bVar3;
  LogicalExpr LVar4;
  int opcode;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  pTVar1 = this->reader_;
  pbVar2 = (byte *)(pTVar1->super_ReaderBase).ptr_;
  (pTVar1->super_ReaderBase).token_ = (char *)pbVar2;
  (pTVar1->super_ReaderBase).ptr_ = (char *)(pbVar2 + 1);
  bVar3 = true;
  LVar4.id_ = *pbVar2 - 0x6c;
  switch(LVar4.id_) {
  case NULL_ID:
  case 2:
  case 7:
    ReadConstant(this,*pbVar2);
    LVar4.id_ = NULL_ID;
    break;
  default:
    goto switchD_001bfe9e_caseD_1;
  case 3:
    opcode = ReadOpCode(this);
    LVar4 = ReadLogicalExpr(this,opcode);
  }
  bVar3 = false;
switchD_001bfe9e_caseD_1:
  if (bVar3) {
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    local_18.field_1.values_ = (Value *)&local_28;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x26490e,&local_18
              );
    LVar4.id_ = NULL_ID;
  }
  return (LogicalExpr)LVar4.id_;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}